

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall QWidgetTextControl::setDocument(QWidgetTextControl *this,QTextDocument *document)

{
  QWidgetTextControlPrivate *this_00;
  QObject *pQVar1;
  QPaintDevice *pQVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  if ((QObject *)this_00->doc != (QObject *)document) {
    QObject::disconnect((QObject *)this_00->doc,(char *)0x0,(QObject *)this,(char *)0x0);
    pQVar1 = (QObject *)QTextDocument::documentLayout();
    QObject::disconnect(pQVar1,(char *)0x0,(QObject *)this,(char *)0x0);
    pQVar2 = (QPaintDevice *)QTextDocument::documentLayout();
    QAbstractTextDocumentLayout::setPaintDevice(pQVar2);
    if (*(QWidgetTextControl **)(*(long *)(this_00->doc + 8) + 0x10) == this) {
      (**(code **)(*(long *)this_00->doc + 0x20))();
    }
    this_00->doc = (QTextDocument *)0x0;
    local_38.d.size = 0;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    QWidgetTextControlPrivate::setContent(this_00,RichText,&local_38,document);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::setDocument(QTextDocument *document)
{
    Q_D(QWidgetTextControl);
    if (d->doc == document)
        return;

    d->doc->disconnect(this);
    d->doc->documentLayout()->disconnect(this);
    d->doc->documentLayout()->setPaintDevice(nullptr);

    if (d->doc->parent() == this)
        delete d->doc;

    d->doc = nullptr;
    d->setContent(Qt::RichText, QString(), document);
}